

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bilateral_filter.hpp
# Opt level: O1

void MeanField::Filtering::applyBilateralKernelY
               (float *input,float *output,uchar *rgb,float *spatialKernel,float *intensityKernel,
               float spatialSD,float intensitySD,int dim,int x,int y,int W,int H)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  void *__s;
  long lVar4;
  long lVar5;
  float *pfVar6;
  int i;
  long lVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar1 = (ulong)(uint)dim;
  lVar9 = (long)dim;
  uVar8 = 0xffffffffffffffff;
  if (-1 < dim) {
    uVar8 = lVar9 * 4;
  }
  __s = operator_new__(uVar8);
  if (0 < dim) {
    memset(__s,0,uVar1 * 4);
  }
  fVar10 = spatialSD;
  if (spatialSD <= intensitySD) {
    fVar10 = intensitySD;
  }
  iVar3 = (int)fVar10;
  fVar10 = 0.0;
  if (-1 < iVar3) {
    lVar2 = (long)(W * y + x) * 3;
    lVar4 = (long)-iVar3;
    lVar5 = (long)W;
    pfVar6 = input + (((long)y - (long)iVar3) * lVar5 + (long)x) * lVar9;
    do {
      lVar7 = lVar4 + y;
      if (lVar7 < H && -1 < lVar7) {
        fVar13 = (float)(int)lVar4;
        fVar11 = 1.0;
        if ((-spatialSD <= fVar13) && (fVar11 = 1.0, fVar13 <= spatialSD)) {
          fVar11 = spatialKernel[(int)ABS(fVar13)];
        }
        fVar12 = 1.0;
        if ((-intensitySD <= fVar13) && (fVar12 = 1.0, fVar13 <= intensitySD)) {
          lVar7 = (lVar7 * lVar5 + (long)x) * 3;
          fVar12 = intensityKernel[(int)ABS((float)rgb[lVar7] - (float)rgb[lVar2])] *
                   intensityKernel[(int)ABS((float)rgb[lVar7 + 1] - (float)rgb[lVar2 + 1])] *
                   intensityKernel[(int)ABS((float)rgb[lVar7 + 2] - (float)rgb[lVar2 + 2])];
        }
        fVar10 = fVar10 + fVar11 * fVar12;
        if (0 < dim) {
          uVar8 = 0;
          do {
            *(float *)((long)__s + uVar8 * 4) =
                 pfVar6[uVar8] * fVar11 * fVar12 + *(float *)((long)__s + uVar8 * 4);
            uVar8 = uVar8 + 1;
          } while (uVar1 != uVar8);
        }
      }
      lVar4 = lVar4 + 1;
      pfVar6 = pfVar6 + lVar9 * lVar5;
    } while (iVar3 + 1 != (int)lVar4);
  }
  if (0 < dim && 0.0 < fVar10) {
    uVar8 = 0;
    do {
      output[(long)((W * y + x) * dim) + uVar8] = *(float *)((long)__s + uVar8 * 4) / fVar10;
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  operator_delete__(__s);
  return;
}

Assistant:

__SHARED_CODE__
            inline void applyBilateralKernelY(const float *input, float *output, const unsigned char *rgb, const float *spatialKernel,
                const float *intensityKernel, float spatialSD, float intensitySD, int dim, int x, int y, int W, int H) {
            float *channelSums = new float[dim];
            for (int i = 0; i < dim; i++) {
                channelSums[i] = 0.0;
            }

            int rad = (spatialSD > intensitySD) ? static_cast<int>(spatialSD) : static_cast<int>(intensitySD);
            float normaliser = 0.0;
            for (int r = -rad; r <= rad; r++) {
                int idx = y + r;
                if (idx < 0 || idx >= H) {
                    continue;
                }

                int pixelIdx = 3 * (y*W + x);
                int neighPixelIdx = 3 * (idx*W + x);

                float spatialFactor = 1.0;
                if (r >= -spatialSD && r <= spatialSD) {
                    spatialFactor = spatialKernel[static_cast<int>(fabs(static_cast<float>(r)))];
                }

                float intensityFactor = 1.0;
                if (r >= -intensitySD && r <= intensitySD) {
                    intensityFactor = intensityKernel[static_cast<int>(fabs(static_cast<float>(rgb[neighPixelIdx]) - static_cast<float>(rgb[pixelIdx])))] *//R
                        intensityKernel[static_cast<int>(fabs(static_cast<float>(rgb[neighPixelIdx + 1]) - static_cast<float>(rgb[pixelIdx + 1])))] *//G
                        intensityKernel[static_cast<int>(fabs(static_cast<float>(rgb[neighPixelIdx + 2]) - static_cast<float>(rgb[pixelIdx + 2])))];//B
                }

                normaliser += spatialFactor * intensityFactor;
                for (int i = 0; i < dim; i++) {
                    channelSums[i] += input[(idx*W + x)*dim + i] * spatialFactor*intensityFactor;
                }
            }

            if (normaliser > 0.0) {
                for (int i = 0; i < dim; i++) {
                    output[(y*W + x)*dim + i] = channelSums[i] / normaliser;
                }
            }

            delete[] channelSums;
        }